

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int outfile(char *filename,int rgb_dir,int vdir,int x,int y,int comp,void *data,int alpha,int pad,
           char *fmt,...)

{
  byte bVar1;
  byte bVar3;
  char in_AL;
  FILE *__stream;
  ulong uVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint8 px [3];
  undefined4 local_13c;
  long local_138;
  long local_130;
  FILE *local_128;
  void *local_120;
  long local_118;
  ulong local_110;
  va_list v;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  byte bVar2;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __stream = fopen(filename,"wb");
  if (__stream != (FILE *)0x0) {
    v[0].reg_save_area = local_e8;
    v[0].overflow_arg_area = &stack0x00000028;
    v[0].gp_offset = 0x30;
    v[0].fp_offset = 0x30;
    writefv((FILE *)__stream,fmt,v);
    local_13c = 0;
    lVar9 = (long)comp;
    local_128 = (FILE *)(ulong)(uint)pad;
    local_110 = 0;
    if (0 < x) {
      local_110 = (ulong)(uint)x;
    }
    local_130 = (long)x;
    pvVar11 = (void *)(((long)y + -1) * lVar9 * local_130 + (long)data);
    local_138 = -(lVar9 * local_130);
    lVar6 = (long)y;
    while (lVar6 != 0) {
      lVar8 = (lVar6 + -1) * local_130;
      local_120 = pvVar11;
      local_118 = lVar6 + -1;
      for (uVar10 = 0; uVar10 != local_110; uVar10 = uVar10 + 1) {
        pbVar5 = (byte *)((uVar10 + lVar8) * lVar9 + (long)data);
        if (comp - 1U < 2) {
          bVar3 = *pbVar5;
          uVar4 = (ulong)(uint)bVar3;
          uVar7 = (ulong)(uint)bVar3;
LAB_001c45b8:
          writef((FILE *)__stream,fmt,uVar4,(ulong)bVar3,uVar7);
        }
        else {
          if (comp == 3) {
LAB_001c459a:
            bVar3 = pbVar5[1];
            bVar1 = pbVar5[2];
            bVar2 = *pbVar5;
LAB_001c45a7:
            uVar7 = (ulong)bVar2;
            uVar4 = (ulong)bVar1;
            goto LAB_001c45b8;
          }
          if (comp == 4) {
            if (alpha != 0) goto LAB_001c459a;
            bVar3 = pbVar5[3];
            for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
              px[lVar6] = (char)((int)(((uint)*(byte *)((long)pvVar11 + lVar6) -
                                       (uint)(byte)(&DAT_0021cc05)[lVar6]) * (uint)bVar3) / 0xff) +
                          (&DAT_0021cc05)[lVar6];
            }
            fmt = (char *)0x3;
            bVar3 = px[1];
            bVar1 = px[2];
            bVar2 = px[0];
            goto LAB_001c45a7;
          }
        }
        if (0 < alpha) {
          fmt = (char *)__stream;
          fputc((int)(char)pbVar5[lVar9 + -1],__stream);
        }
        pvVar11 = (void *)((long)pvVar11 + lVar9);
      }
      fmt = (char *)local_128;
      fwrite(&local_13c,(size_t)local_128,1,__stream);
      pvVar11 = (void *)((long)local_120 + local_138);
      lVar6 = local_118;
    }
    fclose(__stream);
  }
  return (int)(__stream != (FILE *)0x0);
}

Assistant:

static int outfile(char const *filename, int rgb_dir, int vdir, int x, int y, int comp, void *data, int alpha, int pad, char *fmt, ...)
{
   FILE *f = fopen(filename, "wb");
   if (f) {
      va_list v;
      va_start(v, fmt);
      writefv(f, fmt, v);
      va_end(v);
      write_pixels(f,rgb_dir,vdir,x,y,comp,data,alpha,pad);
      fclose(f);
   }
   return f != NULL;
}